

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_TEXM3X3(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x01','\x02');
  if (iVar1 == 0) {
    fail(ctx,"TEXM3X3 opcode not available in Shader Model 1.1");
  }
  state_texm3x3(ctx,"TEXM3X3",0);
  return;
}

Assistant:

static void state_TEXM3X3(Context *ctx)
{
    if (!shader_version_atleast(ctx, 1, 2))
        fail(ctx, "TEXM3X3 opcode not available in Shader Model 1.1");
    state_texm3x3(ctx, "TEXM3X3", 0);
}